

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_bit_encoder.cc
# Opt level: O2

void __thiscall
draco::DirectBitEncoder::EndEncoding(DirectBitEncoder *this,EncoderBuffer *target_buffer)

{
  pointer puVar1;
  uint32_t size_in_byte;
  uint local_1c;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->bits_,&this->local_bits_);
  local_1c = *(int *)&(this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
             *(int *)&(this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start & 0xfffffffc;
  EncoderBuffer::Encode<unsigned_int>(target_buffer,&local_1c);
  EncoderBuffer::Encode
            (target_buffer,
             (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,(ulong)local_1c);
  puVar1 = (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  this->local_bits_ = 0;
  this->num_local_bits_ = 0;
  return;
}

Assistant:

void DirectBitEncoder::EndEncoding(EncoderBuffer *target_buffer) {
  bits_.push_back(local_bits_);
  const uint32_t size_in_byte = static_cast<uint32_t>(bits_.size()) * 4;
  target_buffer->Encode(size_in_byte);
  target_buffer->Encode(bits_.data(), size_in_byte);
  Clear();
}